

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

DdNode * cuddDynamicAllocNode(DdManager *table)

{
  DdNode *pDVar1;
  int *piVar2;
  int iVar3;
  DdSubtable *pDVar4;
  _func_void_long *p_Var5;
  DdNode **ppDVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  p_Var5 = Extra_UtilMMoutOfMemory;
  if (table->nextFree == (DdNode *)0x0) {
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    ppDVar6 = (DdNode **)malloc(0xa000);
    Extra_UtilMMoutOfMemory = p_Var5;
    if (ppDVar6 == (DdNode **)0x0) {
      if (table->stash == (char *)0x0) {
        ppDVar6 = (DdNode **)0x0;
      }
      else {
        free(table->stash);
        table->stash = (char *)0x0;
        table->maxCacheHard = table->cacheSlots - 1;
        table->cacheSlack = ~table->cacheSlots;
        iVar3 = table->size;
        if (0 < (long)iVar3) {
          pDVar4 = table->subtables;
          lVar7 = 0;
          do {
            piVar2 = (int *)((long)&pDVar4->maxKeys + lVar7);
            *piVar2 = *piVar2 << 2;
            lVar7 = lVar7 + 0x38;
          } while ((long)iVar3 * 0x38 - lVar7 != 0);
        }
        ppDVar6 = (DdNode **)malloc(0xa000);
      }
    }
    if (ppDVar6 == (DdNode **)0x0) {
      (*Extra_UtilMMoutOfMemory)(0x9fd8);
      table->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    table->memused = table->memused + 0x9fd8;
    *ppDVar6 = (DdNode *)table->memoryList;
    table->memoryList = ppDVar6;
    uVar8 = (ulong)(0x20 - ((uint)ppDVar6 & 0x1f) & 0xfffffff8);
    pDVar1 = (DdNode *)(uVar8 + (long)ppDVar6);
    lVar9 = 0x3fd;
    lVar7 = (long)ppDVar6 + uVar8;
    do {
      *(undefined4 *)(lVar7 + 4) = 0;
      *(long *)(lVar7 + 8) = lVar7 + 0x28;
      lVar9 = lVar9 + -1;
      lVar7 = lVar7 + 0x28;
    } while (lVar9 != 0);
    pDVar1[0x3fd].ref = 0;
    pDVar1[0x3fd].next = (DdNode *)0x0;
    table->nextFree = pDVar1;
  }
  pDVar1 = table->nextFree;
  table->nextFree = pDVar1->next;
  return pDVar1;
}

Assistant:

DdNode *
cuddDynamicAllocNode(
  DdManager * table)
{
    int     i;
    DdNodePtr *mem;
    DdNode *list, *node;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (table->nextFree == NULL) {        /* free list is empty */
        /* Try to allocate a new block. */
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
//        mem = (DdNodePtr *) ABC_ALLOC(DdNode, DD_MEM_CHUNK + 1);
        mem = (DdNodePtr *) ABC_ALLOC(DdNode, DD_MEM_CHUNK + 2);
        MMoutOfMemory = saveHandler;
        if (mem == NULL && table->stash != NULL) {
            ABC_FREE(table->stash);
            table->stash = NULL;
            /* Inhibit resizing of tables. */
            table->maxCacheHard = table->cacheSlots - 1;
            table->cacheSlack = - (int) (table->cacheSlots + 1);
            for (i = 0; i < table->size; i++) {
                table->subtables[i].maxKeys <<= 2;
            }
//            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
        }
        if (mem == NULL) {
            /* Out of luck. Call the default handler to do
            ** whatever it specifies for a failed malloc.  If this
            ** handler returns, then set error code, print
            ** warning, and return. */
            (*MMoutOfMemory)(sizeof(DdNode)*(DD_MEM_CHUNK + 1));
            table->errorCode = CUDD_MEMORY_OUT;
#ifdef DD_VERBOSE
            (void) fprintf(table->err,
                           "cuddDynamicAllocNode: out of memory");
            (void) fprintf(table->err,"Memory in use = %lu\n",
                           table->memused);
#endif
            return(NULL);
        } else {        /* successful allocation; slice memory */
            unsigned long offset;
            table->memused += (DD_MEM_CHUNK + 1) * sizeof(DdNode);
            mem[0] = (DdNode *) table->memoryList;
            table->memoryList = mem;

            /* Here we rely on the fact that the size of a DdNode is a
            ** power of 2 and a multiple of the size of a pointer.
            ** If we align one node, all the others will be aligned
            ** as well. */
//            offset = (unsigned long) mem & (sizeof(DdNode) - 1);
//            mem += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
            offset = (unsigned long) mem & (32 - 1);
            mem += (32 - offset) / sizeof(DdNodePtr);
#ifdef DD_DEBUG
//            assert(((unsigned long) mem & (sizeof(DdNode) - 1)) == 0);
            assert(((unsigned long) mem & (32 - 1)) == 0);
#endif
            list = (DdNode *) mem;

            i = 1;
            do {
                list[i - 1].ref = 0;
                list[i - 1].next = &list[i];
            } while (++i < DD_MEM_CHUNK);

            list[DD_MEM_CHUNK-1].ref = 0;
            list[DD_MEM_CHUNK - 1].next = NULL;

            table->nextFree = &list[0];
        }
    } /* if free list empty */

    node = table->nextFree;
    table->nextFree = node->next;
    //node->Id = 0;
    return (node);

}